

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

int32_t ucnv_extMatchToU(int32_t *cx,int8_t sisoState,char *pre,int32_t preLength,char *src,
                        int32_t srcLength,uint32_t *pMatchValue,UBool param_8,UBool flush)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  char local_49;
  ulong uVar10;
  
  iVar17 = 0;
  if ((cx != (int32_t *)0x0) && (iVar17 = 0, 0 < cx[2])) {
    if (sisoState == '\0') {
      if (1 < preLength) {
        return 0;
      }
      iVar5 = 1;
      if (srcLength < 1) {
        iVar5 = srcLength;
      }
      srcLength = 0;
      if (preLength != 1) {
        srcLength = iVar5;
      }
      local_49 = '\x01';
    }
    else {
      local_49 = param_8;
    }
    iVar18 = 0;
    iVar19 = 0;
    uVar4 = 0;
    uVar12 = 0;
    iVar17 = 0;
    do {
      uVar8 = *(uint *)((long)cx + (ulong)uVar4 * 4 + (long)cx[1]);
      uVar6 = uVar8 & 0xffffff;
      uVar11 = uVar12;
      iVar16 = iVar17;
      if (uVar6 != 0) {
        iVar13 = iVar19 + iVar18;
        uVar11 = uVar6;
        iVar16 = iVar13;
        if ((-1 < sisoState) &&
           (uVar11 = uVar12, iVar16 = iVar17, (iVar13 != 1) != (sisoState == '\0'))) {
          uVar11 = uVar6;
          iVar16 = iVar13;
        }
      }
      uVar12 = uVar11;
      iVar17 = iVar16;
      if (iVar18 < preLength) {
        pcVar14 = pre;
        iVar13 = iVar19;
        iVar9 = iVar18 + 1;
        iVar7 = iVar18;
      }
      else {
        if (srcLength <= iVar19) {
          if ((local_49 == '\0') && (iVar19 + iVar18 < 0x20)) {
            return -(iVar19 + iVar18);
          }
          goto LAB_0036db39;
        }
        pcVar14 = src;
        iVar13 = iVar19 + 1;
        iVar9 = iVar18;
        iVar7 = iVar19;
      }
      iVar18 = iVar9;
      iVar19 = iVar13;
      lVar3 = (ulong)uVar4 * 4 + (long)cx[1];
      puVar15 = (uint *)((long)cx + lVar3 + 4);
      bVar1 = pcVar14[iVar7];
      uVar4 = *puVar15 >> 0x18;
      if (bVar1 < uVar4) goto LAB_0036db39;
      uVar8 = uVar8 >> 0x18;
      uVar10 = (ulong)uVar8;
      uVar6 = (uint)*(byte *)((long)cx + uVar10 * 4 + lVar3 + 3);
      if (uVar6 < bVar1) goto LAB_0036db39;
      if ((uVar6 - uVar4) + 1 == uVar8) {
        uVar4 = puVar15[(ulong)bVar1 - (ulong)uVar4];
      }
      else {
        uVar4 = (uint)bVar1 * 0x1000000;
        iVar13 = 0;
        while( true ) {
          iVar7 = iVar13;
          iVar9 = (int)uVar10;
          iVar13 = iVar7;
          if (iVar9 - iVar7 < 2) break;
          if ((uint)(iVar9 - iVar7) < 5) {
            if (((puVar15[iVar7] < uVar4) &&
                ((iVar13 = iVar7 + 1, iVar9 <= iVar13 || (puVar15[iVar13] < uVar4)))) &&
               ((iVar13 = iVar7 + 2, iVar9 <= iVar13 || (puVar15[iVar13] < uVar4)))) {
              iVar13 = iVar7 + 3;
            }
            break;
          }
          uVar2 = (long)(iVar9 + iVar7) / 2;
          iVar13 = (int)uVar2;
          if (uVar4 + 0xffffff < puVar15[iVar13]) {
            uVar10 = uVar2 & 0xffffffff;
            iVar13 = iVar7;
          }
        }
        if ((iVar9 <= iVar13) || (uVar4 = puVar15[iVar13], uVar4 >> 0x18 != (uint)bVar1))
        goto LAB_0036db39;
      }
      uVar4 = uVar4 & 0xffffff;
      if (uVar4 == 0) goto LAB_0036db39;
    } while (uVar4 < 0x1f0000);
    iVar19 = iVar19 + iVar18;
    uVar12 = uVar4;
    iVar17 = iVar19;
    if ((-1 < sisoState) && (uVar12 = uVar11, iVar17 = iVar16, (iVar19 != 1) != (sisoState == '\0'))
       ) {
      uVar12 = uVar4;
      iVar17 = iVar19;
    }
LAB_0036db39:
    if (iVar17 == 0) {
      iVar17 = 0;
    }
    else {
      *pMatchValue = uVar12 & 0xff7fffff;
    }
  }
  return iVar17;
}

Assistant:

static int32_t
ucnv_extMatchToU(const int32_t *cx, int8_t sisoState,
                 const char *pre, int32_t preLength,
                 const char *src, int32_t srcLength,
                 uint32_t *pMatchValue,
                 UBool /*useFallback*/, UBool flush) {
    const uint32_t *toUTable, *toUSection;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    uint8_t b;

    if(cx==NULL || cx[UCNV_EXT_TO_U_LENGTH]<=0) {
        return 0; /* no extension data, no match */
    }

    /* initialize */
    toUTable=UCNV_EXT_ARRAY(cx, UCNV_EXT_TO_U_INDEX, uint32_t);
    idx=0;

    matchValue=0;
    i=j=matchLength=0;

    if(sisoState==0) {
        /* SBCS state of an SI/SO stateful converter, look at only exactly 1 byte */
        if(preLength>1) {
            return 0; /* no match of a DBCS sequence in SBCS mode */
        } else if(preLength==1) {
            srcLength=0;
        } else /* preLength==0 */ {
            if(srcLength>1) {
                srcLength=1;
            }
        }
        flush=TRUE;
    }

    /* we must not remember fallback matches when not using fallbacks */

    /* match input units until there is a full match or the input is consumed */
    for(;;) {
        /* go to the next section */
        toUSection=toUTable+idx;

        /* read first pair of the section */
        value=*toUSection++;
        length=UCNV_EXT_TO_U_GET_BYTE(value);
        value=UCNV_EXT_TO_U_GET_VALUE(value);
        if( value!=0 &&
            (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
             TO_U_USE_FALLBACK(useFallback)) &&
            UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
        ) {
            /* remember longest match so far */
            matchValue=value;
            matchLength=i+j;
        }

        /* match pre[] then src[] */
        if(i<preLength) {
            b=(uint8_t)pre[i++];
        } else if(j<srcLength) {
            b=(uint8_t)src[j++];
        } else {
            /* all input consumed, partial match */
            if(flush || (length=(i+j))>UCNV_EXT_MAX_BYTES) {
                /*
                 * end of the entire input stream, stop with the longest match so far
                 * or: partial match must not be longer than UCNV_EXT_MAX_BYTES
                 * because it must fit into state buffers
                 */
                break;
            } else {
                /* continue with more input next time */
                return -length;
            }
        }

        /* search for the current UChar */
        value=ucnv_extFindToU(toUSection, length, b);
        if(value==0) {
            /* no match here, stop with the longest match so far */
            break;
        } else {
            if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
                /* partial match, continue */
                idx=(int32_t)UCNV_EXT_TO_U_GET_PARTIAL_INDEX(value);
            } else {
                if( (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
                     TO_U_USE_FALLBACK(useFallback)) &&
                    UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
                ) {
                    /* full match, stop with result */
                    matchValue=value;
                    matchLength=i+j;
                } else {
                    /* full match on fallback not taken, stop with the longest match so far */
                }
                break;
            }
        }
    }

    if(matchLength==0) {
        /* no match at all */
        return 0;
    }

    /* return result */
    *pMatchValue=UCNV_EXT_TO_U_MASK_ROUNDTRIP(matchValue);
    return matchLength;
}